

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshManipulator.cpp
# Opt level: O0

vector3df irr::scene::getAngleWeight(vector3df *v1,vector3df *v2,vector3df *v3)

{
  vector3df vVar1;
  float fVar2;
  float fVar3;
  float __x;
  float fVar4;
  float __x_00;
  float fVar5;
  float nx;
  f32 csqrt;
  f32 c;
  f32 bsqrt;
  f32 b;
  f32 asqrt;
  f32 a;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  vector3d<float> local_c;
  
  fVar2 = core::vector3d<float>::getDistanceFromSQ
                    ((vector3d<float> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (vector3d<float> *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  fVar3 = sqrtf(fVar2);
  __x = core::vector3d<float>::getDistanceFromSQ
                  ((vector3d<float> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (vector3d<float> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  fVar4 = sqrtf(__x);
  __x_00 = core::vector3d<float>::getDistanceFromSQ
                     ((vector3d<float> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (vector3d<float> *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  fVar5 = sqrtf(__x_00);
  nx = acosf(((__x + __x_00) - fVar2) / ((fVar4 + fVar4) * fVar5));
  fVar5 = acosf(((__x_00 - __x) + fVar2) / ((fVar3 + fVar3) * fVar5));
  fVar2 = acosf(((__x - __x_00) + fVar2) / ((fVar4 + fVar4) * fVar3));
  core::vector3d<float>::vector3d(&local_c,nx,fVar5,fVar2);
  vVar1.Z = local_c.Z;
  vVar1.X = local_c.X;
  vVar1.Y = local_c.Y;
  return vVar1;
}

Assistant:

static inline core::vector3df getAngleWeight(const core::vector3df &v1,
		const core::vector3df &v2,
		const core::vector3df &v3)
{
	// Calculate this triangle's weight for each of its three vertices
	// start by calculating the lengths of its sides
	const f32 a = v2.getDistanceFromSQ(v3);
	const f32 asqrt = sqrtf(a);
	const f32 b = v1.getDistanceFromSQ(v3);
	const f32 bsqrt = sqrtf(b);
	const f32 c = v1.getDistanceFromSQ(v2);
	const f32 csqrt = sqrtf(c);

	// use them to find the angle at each vertex
	return core::vector3df(
			acosf((b + c - a) / (2.f * bsqrt * csqrt)),
			acosf((-b + c + a) / (2.f * asqrt * csqrt)),
			acosf((b - c + a) / (2.f * bsqrt * asqrt)));
}